

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlayout.cpp
# Opt level: O3

bool __thiscall QLayout::isEmpty(QLayout *this)

{
  char cVar1;
  long *plVar2;
  int iVar3;
  
  plVar2 = (long *)(**(code **)(*(long *)this + 0xa8))(this,0);
  if (plVar2 == (long *)0x0) {
    cVar1 = '\x01';
  }
  else {
    iVar3 = 1;
    do {
      cVar1 = (**(code **)(*plVar2 + 0x40))(plVar2);
      if (cVar1 == '\0') {
        return false;
      }
      plVar2 = (long *)(**(code **)(*(long *)this + 0xa8))(this,iVar3);
      iVar3 = iVar3 + 1;
    } while (plVar2 != (long *)0x0);
  }
  return (bool)cVar1;
}

Assistant:

bool QLayout::isEmpty() const
{
    int i = 0;
    QLayoutItem *item = itemAt(i);
    while (item) {
        if (!item->isEmpty())
            return false;
        ++i;
        item = itemAt(i);
    }
    return true;
}